

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void renameParentFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  int iVar1;
  int iVar2;
  uchar *z;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  sqlite3 *db;
  size_t __n;
  uchar *puVar6;
  int token;
  int local_6c;
  char *local_68;
  sqlite3 *local_60;
  uchar *local_58;
  sqlite3_context *local_50;
  char *local_48;
  void *local_40;
  char *local_38;
  
  db = context->pOut->db;
  z = (uchar *)sqlite3ValueText(*argv,'\x01');
  pcVar3 = (char *)sqlite3ValueText(argv[1],'\x01');
  local_40 = sqlite3ValueText(argv[2],'\x01');
  if (pcVar3 == (char *)0x0 || z == (uchar *)0x0) {
    return;
  }
  local_58 = z;
  local_50 = context;
  local_38 = pcVar3;
  if (*z == '\0') {
    local_68 = (char *)0x0;
  }
  else {
    local_68 = (char *)0x0;
    local_60 = db;
    do {
      iVar1 = sqlite3GetToken(z,&local_6c);
      if (local_6c == 0x69) {
        do {
          puVar6 = z;
          z = puVar6 + iVar1;
          iVar1 = sqlite3GetToken(z,&local_6c);
          db = local_60;
        } while (local_6c == 0x97);
        __n = (size_t)iVar1;
        if (puVar6 == (uchar *)0x0) {
          pcVar3 = (char *)0x0;
        }
        else {
          pcVar3 = (char *)sqlite3DbMallocRaw(local_60,__n + 1);
          if (pcVar3 != (char *)0x0) {
            memcpy(pcVar3,z,__n);
            pcVar3[__n] = '\0';
          }
        }
        if (pcVar3 != (char *)0x0) {
          sqlite3Dequote(pcVar3);
          iVar2 = sqlite3_stricmp(local_38,pcVar3);
          pcVar4 = local_68;
          if (iVar2 == 0) {
            pcVar5 = local_68;
            if (local_68 == (char *)0x0) {
              pcVar5 = "";
            }
            local_48 = sqlite3MPrintf(db,"%s%.*s\"%w\"",pcVar5,(ulong)(uint)((int)z - (int)local_58)
                                      ,local_58,local_40);
            sqlite3DbFree(local_60,pcVar4);
            local_58 = z + __n;
            local_68 = local_48;
            db = local_60;
          }
          sqlite3DbFree(db,pcVar3);
        }
        if (pcVar3 == (char *)0x0) break;
      }
      puVar6 = z + iVar1;
      z = z + iVar1;
    } while (*puVar6 != '\0');
  }
  pcVar3 = local_68;
  pcVar4 = "";
  if (local_68 != (char *)0x0) {
    pcVar4 = local_68;
  }
  pcVar4 = sqlite3MPrintf(db,"%s%s",pcVar4,local_58);
  setResultStrOrError(local_50,pcVar4,-1,'\x01',sqlite3MallocSize);
  sqlite3DbFree(db,pcVar3);
  return;
}

Assistant:

static void renameParentFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char *zOutput = 0;
  char *zResult;
  unsigned char const *zInput = sqlite3_value_text(argv[0]);
  unsigned char const *zOld = sqlite3_value_text(argv[1]);
  unsigned char const *zNew = sqlite3_value_text(argv[2]);

  unsigned const char *z;         /* Pointer to token */
  int n;                          /* Length of token z */
  int token;                      /* Type of token */

  UNUSED_PARAMETER(NotUsed);
  if( zInput==0 || zOld==0 ) return;
  for(z=zInput; *z; z=z+n){
    n = sqlite3GetToken(z, &token);
    if( token==TK_REFERENCES ){
      char *zParent;
      do {
        z += n;
        n = sqlite3GetToken(z, &token);
      }while( token==TK_SPACE );

      zParent = sqlite3DbStrNDup(db, (const char *)z, n);
      if( zParent==0 ) break;
      sqlite3Dequote(zParent);
      if( 0==sqlite3StrICmp((const char *)zOld, zParent) ){
        char *zOut = sqlite3MPrintf(db, "%s%.*s\"%w\"", 
            (zOutput?zOutput:""), (int)(z-zInput), zInput, (const char *)zNew
        );
        sqlite3DbFree(db, zOutput);
        zOutput = zOut;
        zInput = &z[n];
      }
      sqlite3DbFree(db, zParent);
    }
  }

  zResult = sqlite3MPrintf(db, "%s%s", (zOutput?zOutput:""), zInput), 
  sqlite3_result_text(context, zResult, -1, SQLITE_DYNAMIC);
  sqlite3DbFree(db, zOutput);
}